

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  DataType dataType;
  Allocation *pAVar1;
  pointer pSVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  VkDevice device;
  DeviceInterface *vkd;
  long lVar7;
  InternalError *this_00;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  int vecNdx;
  ulong uVar11;
  pointer pVVar12;
  bool bVar13;
  bool bVar14;
  allocator<char> local_8d;
  int local_8c;
  int local_88;
  uint local_84;
  BufferIoExecutor *local_80;
  void **local_78;
  ulong local_70;
  size_t local_68;
  void *local_60;
  void *local_58;
  string local_50;
  
  local_78 = outputPtrs;
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vkd = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  pVVar12 = (this->m_outputLayout).
            super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar10 = 0;
  if (pVVar12 !=
      (this->m_outputLayout).
      super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    dVar10 = pVVar12->stride;
  }
  pAVar1 = (this->m_outputAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,
             (long)(int)(dVar10 * numValues));
  if (numValues < 1) {
    numValues = 0;
  }
  uVar11 = 0;
  local_88 = numValues;
  local_80 = this;
  while( true ) {
    pSVar2 = (local_80->super_ShaderExecutor).m_shaderSpec.outputs.
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(local_80->super_ShaderExecutor).m_shaderSpec.outputs.
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
    if ((ulong)(lVar7 / 0x38) <= uVar11) {
      return;
    }
    if (pSVar2[uVar11].varType.m_type != TYPE_BASIC) break;
    pVVar12 = (local_80->m_outputLayout).
              super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar11;
    local_58 = ((local_80->m_outputAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
    local_60 = local_78[uVar11];
    dataType = pSVar2[uVar11].varType.m_data.basic.type;
    bVar13 = dataType - TYPE_FLOAT_MAT2 < 9;
    bVar14 = dataType - TYPE_DOUBLE_MAT2 < 9;
    local_70 = uVar11;
    iVar4 = glu::getDataTypeScalarSize(dataType);
    uVar5 = 1;
    if (bVar14 || bVar13) {
      uVar5 = glu::getDataTypeMatrixNumColumns(dataType);
    }
    uVar6 = 0;
    uVar3 = uVar5;
    if ((int)uVar5 < 1) {
      uVar3 = uVar6;
    }
    local_68 = (long)(iVar4 / (int)uVar5) * 4;
    local_8c = iVar4 << 2;
    for (iVar9 = 0; iVar9 != local_88; iVar9 = iVar9 + 1) {
      local_84 = uVar6;
      for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
        iVar8 = pVVar12->matrixStride * (int)uVar11;
        if (!bVar14 && !bVar13) {
          iVar8 = 0;
        }
        memcpy((void *)((long)local_60 + (long)(int)uVar6),
               (void *)((long)(int)(iVar8 + pVVar12->stride * iVar9 + pVVar12->offset) +
                       (long)local_58),local_68);
        uVar6 = uVar6 + (iVar4 / (int)uVar5) * 4;
      }
      uVar6 = local_84 + local_8c;
    }
    uVar11 = local_70 + 1;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38,0x38,lVar7 % 0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unsupported type",&local_8d);
  tcu::InternalError::InternalError(this_00,&local_50);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const VkDevice			vkDevice			= m_context.getDevice();
	const DeviceInterface&	vk					= m_context.getDeviceInterface();

	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues * outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	invalidateMappedMemoryRange(vk, vkDevice, m_outputAlloc->getMemory(), m_outputAlloc->getOffset(), outputBufferSize);

	DE_ASSERT(m_shaderSpec.outputs.size() == m_outputLayout.size());
	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		const glu::VarType&		varType		= m_shaderSpec.outputs[outputNdx].varType;
		const VarLayout&		layout		= m_outputLayout[outputNdx];

		copyFromBuffer(varType, layout, numValues, m_outputAlloc->getHostPtr(), outputPtrs[outputNdx]);
	}
}